

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_kiss.c
# Opt level: O2

int csp_kiss_tx(csp_iface_t *iface,uint16_t via,csp_packet_t *packet,int from_me)

{
  uint8_t *puVar1;
  uint8_t uVar2;
  undefined8 *puVar3;
  void *driver_data;
  uint8_t *puVar4;
  undefined8 in_RAX;
  undefined8 uVar5;
  long lVar6;
  uint8_t *puVar7;
  uchar esc_esc [2];
  uchar esc_end [2];
  uchar stop [1];
  undefined4 uStack_34;
  uchar start [2];
  
  puVar3 = (undefined8 *)iface->interface_data;
  driver_data = iface->driver_data;
  _esc_esc = in_RAX;
  csp_usart_lock(driver_data);
  csp_crc32_append(packet);
  csp_id_prepend(packet);
  _esc_esc = CONCAT26(0xc0,_esc_esc);
  _esc_esc = CONCAT44(uStack_34,0xdcdb0000);
  _esc_esc = CONCAT62(_esc_end,0xdddb);
  puVar4 = (packet->field_0).field_1.frame_begin;
  (*(code *)*puVar3)(driver_data,start,2);
  for (lVar6 = 0; (uint)lVar6 < (uint)(packet->field_0).field_1.frame_length; lVar6 = lVar6 + 1) {
    puVar1 = puVar4 + lVar6;
    uVar2 = *puVar1;
    uVar5 = 2;
    puVar7 = esc_esc;
    if (uVar2 != 0xdb) {
      if (uVar2 == 0xc0) {
        puVar7 = esc_end;
      }
      else {
        uVar5 = 1;
        puVar7 = puVar1;
      }
    }
    (*(code *)*puVar3)(driver_data,puVar7,uVar5);
  }
  _esc_esc = CONCAT15(0xc0,_esc_esc);
  (*(code *)*puVar3)(driver_data,stop,1);
  csp_usart_unlock(driver_data);
  csp_buffer_free(packet);
  return 0;
}

Assistant:

int csp_kiss_tx(csp_iface_t * iface, uint16_t via, csp_packet_t * packet, int from_me) {

	csp_kiss_interface_data_t * ifdata = iface->interface_data;
	void * driver = iface->driver_data;

	/* Lock (before modifying packet) */
	csp_usart_lock(driver);

	/* Add CRC32 checksum */
	csp_crc32_append(packet);

	/* Save the outgoing id in the buffer */
	csp_id_prepend(packet);

	/* Transmit data */
	const unsigned char start[] = {FEND, TNC_DATA};
	const unsigned char esc_end[] = {FESC, TFEND};
	const unsigned char esc_esc[] = {FESC, TFESC};
	const unsigned char * data = packet->frame_begin;

	ifdata->tx_func(driver, start, sizeof(start));

	for (unsigned int i = 0; i < packet->frame_length; i++, ++data) {
		if (*data == FEND) {
			ifdata->tx_func(driver, esc_end, sizeof(esc_end));
			continue;
		}
		if (*data == FESC) {
			ifdata->tx_func(driver, esc_esc, sizeof(esc_esc));
			continue;
		}
		ifdata->tx_func(driver, data, 1);
	}
	const unsigned char stop[] = {FEND};
	ifdata->tx_func(driver, stop, sizeof(stop));

	/* Unlock */
	csp_usart_unlock(driver);

	/* Free data */
	csp_buffer_free(packet);

	return CSP_ERR_NONE;
}